

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintHelpFull(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  cmDocumentation *this_00;
  allocator<char> local_31;
  
  this_00 = (cmDocumentation *)&stack0xffffffffffffffd0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffd0,"index",&local_31);
  bVar1 = PrintFiles(this_00,os,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return bVar1;
}

Assistant:

bool cmDocumentation::PrintHelpFull(std::ostream& os)
{
  return this->PrintFiles(os, "index");
}